

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunctionRotation.cpp
# Opt level: O2

ChVector<double> * __thiscall
chrono::ChFunctionRotation::Get_w_loc
          (ChVector<double> *__return_storage_ptr__,ChFunctionRotation *this,double s)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  ChQuaternion<double> q0;
  undefined1 local_120 [32];
  ChQuaternion<double> local_100;
  double local_e0;
  double dStack_d8;
  double dStack_d0;
  double dStack_c8;
  undefined1 local_c0 [48];
  undefined1 local_90 [16];
  undefined1 local_80 [16];
  undefined1 local_70 [16];
  
  (*this->_vptr_ChFunctionRotation[3])(&local_e0);
  (*this->_vptr_ChFunctionRotation[3])(s + 1e-07,local_120,this);
  auVar7._8_8_ = dStack_d8;
  auVar7._0_8_ = local_e0;
  auVar4._16_8_ = dStack_d0;
  auVar4._0_16_ = auVar7;
  auVar4._24_8_ = dStack_c8;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = dStack_d0;
  auVar2 = vshufpd_avx(local_120._0_16_,local_120._0_16_,1);
  auVar3 = vshufpd_avx(auVar7,auVar7,1);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = local_e0;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = local_120._0_8_;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = auVar3._0_8_ * auVar2._0_8_;
  auVar1 = vfmadd132sd_fma(auVar12,auVar9,auVar1);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = dStack_c8;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = local_120._16_8_;
  auVar1 = vfmadd231sd_fma(auVar1,auVar13,auVar2);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = local_120._24_8_;
  auVar1 = vfmadd132sd_fma(auVar10,auVar1,auVar3);
  if (auVar1._0_8_ < 0.0) {
    auVar5._8_8_ = 0x8000000000000000;
    auVar5._0_8_ = 0x8000000000000000;
    auVar5._16_8_ = 0x8000000000000000;
    auVar5._24_8_ = 0x8000000000000000;
    local_120 = vxorpd_avx512vl(local_120,auVar5);
  }
  auVar4 = vsubpd_avx(local_120,auVar4);
  auVar6._8_8_ = 0x416312d000000000;
  auVar6._0_8_ = 0x416312d000000000;
  auVar6._16_8_ = 0x416312d000000000;
  auVar6._24_8_ = 0x416312d000000000;
  local_100.m_data = (double  [4])vmulpd_avx512vl(auVar4,auVar6);
  local_90._0_8_ = local_e0 + local_e0;
  local_90._8_8_ = dStack_d8 + dStack_d8;
  auVar8._0_8_ = dStack_d0 + dStack_d0;
  auVar8._8_8_ = dStack_c8 + dStack_c8;
  auVar1 = vshufpd_avx(local_90,local_90,1);
  local_c0._32_8_ = -auVar8._0_8_;
  local_c0._40_8_ = -auVar8._8_8_;
  auVar11._0_8_ = auVar1._0_8_ ^ 0x8000000000000000;
  auVar11._8_8_ = auVar1._8_8_ ^ 0x8000000000000000;
  local_c0._24_8_ = vmovlpd_avx(local_c0._32_16_);
  local_c0._0_8_ = vmovlpd_avx(auVar11);
  local_80 = vshufpd_avx(local_c0._32_16_,auVar8,1);
  local_70 = vunpcklpd_avx(auVar11,local_90);
  local_c0._8_8_ = local_90._0_8_;
  local_c0._16_8_ = auVar8._8_8_;
  chrono::operator*((ChMatrix34<double> *)local_c0,&local_100);
  return __return_storage_ptr__;
}

Assistant:

ChVector<> ChFunctionRotation::Get_w_loc(double s) const { 
		ChQuaternion<> q0 = Get_q(s);
		ChQuaternion<> q1 = Get_q(s + BDF_STEP_LOW);
		if (q0.Dot(q1) < 0)
			q1 = -q1; // because q1 and -q1 are the same rotation, but for finite difference we must use the closest to q0
		ChQuaternion<> qdt = (q1 - q0) / BDF_STEP_LOW;
		ChGlMatrix34<> Gl(q0);
        return Gl * qdt;
}